

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void __thiscall PClassActor::InitializeNativeDefaults(PClassActor *this)

{
  uint uVar1;
  PClass *pPVar2;
  BYTE *__src;
  uint uVar3;
  BYTE *__dest;
  
  PSymbolTable::SetParentTable
            (&(this->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
              Symbols,&(((this->super_PClass).ParentClass)->super_PStruct).super_PNamedType.
                       super_PCompoundType.super_PType.Symbols);
  if ((this->super_PClass).Defaults != (BYTE *)0x0) {
    __assert_fail("Defaults == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/info.cpp"
                  ,0x16d,"void PClassActor::InitializeNativeDefaults()");
  }
  __dest = (BYTE *)M_Malloc_Dbg((ulong)*(uint *)&(this->super_PClass).super_PStruct.super_PNamedType
                                                 .super_PCompoundType.super_PType.super_DObject.
                                                 field_0x24,
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/info.cpp"
                                ,0x16e);
  (this->super_PClass).Defaults = __dest;
  pPVar2 = (this->super_PClass).ParentClass;
  __src = pPVar2->Defaults;
  if (__src == (BYTE *)0x0) {
    uVar3 = *(uint *)&(this->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                      super_PType.super_DObject.field_0x24;
  }
  else {
    memcpy(__dest,__src,
           (ulong)*(uint *)&(pPVar2->super_PStruct).super_PNamedType.super_PCompoundType.super_PType
                            .super_DObject.field_0x24);
    uVar3 = *(uint *)&(this->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                      super_PType.super_DObject.field_0x24;
    uVar1 = *(uint *)&(((this->super_PClass).ParentClass)->super_PStruct).super_PNamedType.
                      super_PCompoundType.super_PType.super_DObject.field_0x24;
    if (uVar3 <= uVar1) {
      return;
    }
    __dest = (this->super_PClass).Defaults + uVar1;
    uVar3 = uVar3 - uVar1;
  }
  memset(__dest,0,(ulong)uVar3);
  return;
}

Assistant:

void PClassActor::InitializeNativeDefaults()
{
	Symbols.SetParentTable(&ParentClass->Symbols);
	assert(Defaults == NULL);
	Defaults = (BYTE *)M_Malloc(Size);
	if (ParentClass->Defaults != NULL) 
	{
		memcpy(Defaults, ParentClass->Defaults, ParentClass->Size);
		if (Size > ParentClass->Size)
		{
			memset(Defaults + ParentClass->Size, 0, Size - ParentClass->Size);
		}
	}
	else
	{
		memset (Defaults, 0, Size);
	}
}